

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

Own<capnp::_::CapTableBuilder,_std::nullptr_t> __thiscall
capnp::MessageBuilder::releaseBuiltinCapTable(MessageBuilder *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  CapTableBuilder *extraout_RDX;
  long in_RSI;
  Own<capnp::_::CapTableBuilder,_std::nullptr_t> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR_extractCap_006d43e8;
  uVar1 = *(undefined8 *)(in_RSI + 0x30);
  puVar2[1] = *(undefined8 *)(in_RSI + 0x28);
  puVar2[2] = uVar1;
  uVar1 = *(undefined8 *)(in_RSI + 0x40);
  puVar2[3] = *(undefined8 *)(in_RSI + 0x38);
  puVar2[4] = uVar1;
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  *(undefined8 *)(in_RSI + 0x38) = 0;
  this->_vptr_MessageBuilder =
       (_func_int **)&kj::_::HeapDisposer<capnp::_::BuilderArena::LocalCapTable>::instance;
  this->arenaSpace[0] = puVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<_::CapTableBuilder> MessageBuilder::releaseBuiltinCapTable() {
  return arena()->releaseLocalCapTable();
}